

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadGeometry(OgreBinarySerializer *this,VertexData *dest)

{
  bool bVar1;
  uint32_t uVar2;
  Logger *this_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *this_01;
  basic_formatter *this_02;
  bool local_1ea;
  uint16_t local_1be;
  uint16_t id;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_38;
  VertexData *local_18;
  VertexData *dest_local;
  OgreBinarySerializer *this_local;
  
  local_18 = dest;
  dest_local = (VertexData *)this;
  uVar2 = Read<unsigned_int>(this);
  (local_18->super_IVertexData).count = uVar2;
  this_00 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[25]>(&local_1b0,(char (*) [25])"  - Reading geometry of ");
  this_01 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       &local_1b0,(uint *)local_18);
  this_02 = (basic_formatter *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      (this_01,(char (*) [10])0xbbdaca);
  Formatter::basic_formatter::operator_cast_to_string(&local_38,this_02);
  Logger::debug(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_1b0);
  bVar1 = AtEnd(this);
  if (!bVar1) {
    local_1be = ReadHeader(this,true);
    while( true ) {
      bVar1 = AtEnd(this);
      local_1ea = false;
      if (!bVar1) {
        local_1ea = local_1be == 0x5100 || local_1be == 0x5200;
      }
      if (!local_1ea) break;
      if (local_1be == 0x5100) {
        ReadGeometryVertexDeclaration(this,local_18);
      }
      else if (local_1be == 0x5200) {
        ReadGeometryVertexBuffer(this,local_18);
      }
      bVar1 = AtEnd(this);
      if (!bVar1) {
        local_1be = ReadHeader(this,true);
      }
    }
    bVar1 = AtEnd(this);
    if (!bVar1) {
      RollbackHeader(this);
    }
  }
  return;
}

Assistant:

void OgreBinarySerializer::ReadGeometry(VertexData *dest)
{
    dest->count = Read<uint32_t>();

    ASSIMP_LOG_DEBUG_F( "  - Reading geometry of ", dest->count, " vertices");

    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        while (!AtEnd() &&
            (id == M_GEOMETRY_VERTEX_DECLARATION ||
             id == M_GEOMETRY_VERTEX_BUFFER))
        {
            switch(id)
            {
                case M_GEOMETRY_VERTEX_DECLARATION:
                {
                    ReadGeometryVertexDeclaration(dest);
                    break;
                }
                case M_GEOMETRY_VERTEX_BUFFER:
                {
                    ReadGeometryVertexBuffer(dest);
                    break;
                }
            }

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }
}